

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

void __thiscall
duckdb_shell::ShellState::UTF8WidthPrint
          (ShellState *this,FILE *pOut,idx_t w,string *str,bool right_align)

{
  char *__s;
  long lVar1;
  uint uVar2;
  ulong in_RAX;
  size_t len;
  ulong uVar3;
  int iVar4;
  int max_width;
  int n;
  undefined8 uStack_28;
  
  __s = (str->_M_dataplus)._M_p;
  uStack_28 = in_RAX;
  len = strlen(__s);
  max_width = (int)w;
  uVar2 = linenoiseGetRenderPosition(__s,len,max_width,(int *)((long)&uStack_28 + 4));
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 0) {
    uStack_28 = uStack_28 & 0xffffffff;
    uVar3 = 0;
    if (*__s != '\0') {
      iVar4 = 0;
      do {
        iVar4 = iVar4 + 1;
        uStack_28 = CONCAT44(iVar4,(undefined4)uStack_28);
        if (iVar4 == max_width) {
          uVar3 = uVar3 + 1;
          break;
        }
        lVar1 = uVar3 + 1;
        uVar3 = uVar3 + 1;
      } while (__s[lVar1] != '\0');
    }
  }
  uVar2 = max_width - uStack_28._4_4_;
  if (uVar2 == 0 || max_width < uStack_28._4_4_) {
    fprintf((FILE *)pOut,"%.*s",uVar3 & 0xffffffff,__s);
  }
  else if (right_align) {
    fprintf((FILE *)pOut,"%*s%s",(ulong)uVar2,anon_var_dwarf_643533f + 9,__s);
  }
  else {
    fprintf((FILE *)pOut,"%s%*s",__s,(ulong)uVar2,anon_var_dwarf_643533f + 9);
  }
  return;
}

Assistant:

void ShellState::UTF8WidthPrint(FILE *pOut, idx_t w, const string &str, bool right_align) {
	auto zUtf = str.c_str();
	int i;
	int n;
	int aw = w < 0 ? -w : w;
#ifdef HAVE_LINENOISE
	i = linenoiseGetRenderPosition(zUtf, strlen(zUtf), aw, &n);
	if (i < 0)
#endif
		for (i = n = 0; zUtf[i]; i++) {
			if ((zUtf[i] & 0xc0) != 0x80) {
				n++;
				if (n == aw) {
					do {
						i++;
					} while ((zUtf[i] & 0xc0) == 0x80);
					break;
				}
			}
		}
	if (n >= aw) {
		utf8_printf(pOut, "%.*s", i, zUtf);
	} else if (right_align) {
		utf8_printf(pOut, "%*s%s", aw - n, "", zUtf);
	} else {
		utf8_printf(pOut, "%s%*s", zUtf, aw - n, "");
	}
}